

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

void __thiscall
duckdb::ClientContext::Append
          (ClientContext *this,TableDescription *description,ColumnDataCollection *collection,
          optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true> column_ids)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  vector<duckdb::LogicalIndex,_true> *local_30;
  
  local_50._8_8_ = 0;
  local_30 = column_ids.ptr;
  local_50._M_unused._M_object = operator_new(0x20);
  *(ClientContext **)local_50._M_unused._0_8_ = this;
  *(TableDescription **)((long)local_50._M_unused._0_8_ + 8) = description;
  *(ColumnDataCollection **)((long)local_50._M_unused._0_8_ + 0x10) = collection;
  *(vector<duckdb::LogicalIndex,_true> ***)((long)local_50._M_unused._0_8_ + 0x18) = &local_30;
  local_38 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:1201:27)>
             ::_M_invoke;
  local_40 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:1201:27)>
             ::_M_manager;
  RunFunctionInTransaction(this,(function<void_()> *)&local_50,true);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void ClientContext::Append(TableDescription &description, ColumnDataCollection &collection,
                           optional_ptr<const vector<LogicalIndex>> column_ids) {

	RunFunctionInTransaction([&]() {
		auto &table_entry =
		    Catalog::GetEntry<TableCatalogEntry>(*this, description.database, description.schema, description.table);
		// verify that the table columns and types match up
		if (description.PhysicalColumnCount() != table_entry.GetColumns().PhysicalColumnCount()) {
			throw InvalidInputException("Failed to append: table entry has different number of columns!");
		}
		idx_t table_entry_col_idx = 0;
		for (idx_t i = 0; i < description.columns.size(); i++) {
			auto &column = description.columns[i];
			if (column.Generated()) {
				continue;
			}
			if (column.Type() != table_entry.GetColumns().GetColumn(PhysicalIndex(table_entry_col_idx)).Type()) {
				throw InvalidInputException("Failed to append: table entry has different number of columns!");
			}
			table_entry_col_idx++;
		}
		auto binder = Binder::CreateBinder(*this);
		auto bound_constraints = binder->BindConstraints(table_entry);
		MetaTransaction::Get(*this).ModifyDatabase(table_entry.ParentCatalog().GetAttached());
		table_entry.GetStorage().LocalAppend(table_entry, *this, collection, bound_constraints, column_ids);
	});
}